

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

bool __thiscall
boost::ext::ut::v1_1_8::
runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16>::on<baryonyx::result>
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this,
          assertion<baryonyx::result> *assertion)

{
  bool bVar1;
  assertion_fail<baryonyx::result> local_1a0;
  assertion_pass<baryonyx::result> local_d8;
  assertion<baryonyx::result> *local_20;
  assertion<baryonyx::result> *assertion_local;
  runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this_local;
  
  if ((this->dry_run_ & 1U) == 0) {
    local_20 = assertion;
    assertion_local = (assertion<baryonyx::result> *)this;
    bVar1 = baryonyx::result::operator_cast_to_bool(&assertion->expr);
    if (bVar1) {
      baryonyx::result::result(&local_d8.expr,&assertion->expr);
      local_d8.location.line_ = (assertion->location).line_;
      local_d8.location.file_ = (assertion->location).file_;
      reporter<boost::ext::ut::v1_1_8::printer>::on<baryonyx::result>(&this->reporter_,&local_d8);
      events::assertion_pass<baryonyx::result>::~assertion_pass(&local_d8);
      this_local._7_1_ = true;
    }
    else {
      this->fails_ = this->fails_ + 1;
      baryonyx::result::result(&local_1a0.expr,&assertion->expr);
      local_1a0.location.line_ = (assertion->location).line_;
      local_1a0.location.file_ = (assertion->location).file_;
      reporter<boost::ext::ut::v1_1_8::printer>::on<baryonyx::result>(&this->reporter_,&local_1a0);
      events::assertion_fail<baryonyx::result>::~assertion_fail(&local_1a0);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

[[nodiscard]] auto on(events::assertion<TExpr> assertion) -> bool {
      if (dry_run_) {
        return true;
      }

      if (static_cast<bool>(assertion.expr)) {
        reporter_.on(events::assertion_pass<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return true;
      } else {
        ++fails_;
        reporter_.on(events::assertion_fail<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return false;
      }
    }